

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_constant_inline.cpp
# Opt level: O2

void __thiscall
mocker::GlobalConstantInline::checkFunc(GlobalConstantInline *this,FunctionModule *func)

{
  _List_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  iterator __it;
  _List_node_base *p_Var5;
  RegMap<std::int64_t> *this_00;
  _func_int **pp_Var6;
  shared_ptr<mocker::ir::IntLiteral> lit;
  shared_ptr<mocker::ir::Store> store;
  shared_ptr<mocker::ir::Reg> globalReg;
  shared_ptr<mocker::ir::Addr> local_70;
  long local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  shared_ptr<mocker::ir::Addr> local_40;
  
  local_48 = (_List_node_base *)&func->bbs;
  this_00 = &this->constant;
  local_50 = local_48;
  do {
    local_48 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                &local_48->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_48 == local_50) {
      return;
    }
    p_Var1 = local_48 + 1;
    p_Var5 = (_List_node_base *)&p_Var1->_M_prev;
    while (p_Var5 = p_Var5->_M_next, p_Var5 != (_List_node_base *)&p_Var1->_M_prev) {
      ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_60,(shared_ptr<mocker::ir::IRInst> *)(p_Var5 + 1));
      if (local_60 != 0) {
        ir::dycGlobalReg(&local_40);
        if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          bVar2 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                            (&this->defined,(shared_ptr<mocker::ir::Reg> *)&local_40);
          std::
          _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::shared_ptr<mocker::ir::Reg>&>
                    ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->defined,&local_40);
          if ((!bVar2) ||
             (bVar3 = isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,long,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,long>>>,std::shared_ptr<mocker::ir::Reg>>
                                (this_00,(shared_ptr<mocker::ir::Reg> *)&local_40), bVar3)) {
            std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_70);
            if (local_70.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar2 = isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,long,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,long>>>,std::shared_ptr<mocker::ir::Reg>>
                                (this_00,(shared_ptr<mocker::ir::Reg> *)&local_40);
              if (bVar2) {
LAB_001589a0:
                __it = std::
                       _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&this_00->_M_h,(key_type *)&local_40);
                std::
                _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase(&this_00->_M_h,
                        (const_iterator)
                        __it.
                        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                        ._M_cur);
              }
            }
            else {
              if (bVar2) {
                pmVar4 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::at((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)&local_40);
                pp_Var6 = (_func_int **)*pmVar4;
                if (pp_Var6 !=
                    local_70.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1]._vptr_Addr) goto LAB_001589a0;
              }
              else {
                pp_Var6 = local_70.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr[1]._vptr_Addr;
              }
              pmVar4 = std::__detail::
                       _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)this_00,(key_type *)&local_40);
              *pmVar4 = (mapped_type)pp_Var6;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_70.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    }
  } while( true );
}

Assistant:

void GlobalConstantInline::checkFunc(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto store = ir::dyc<ir::Store>(inst);
      if (!store)
        continue;
      auto globalReg = ir::dycGlobalReg(store->getAddr());
      if (!globalReg)
        continue;

      bool firstTime = !isIn(defined, globalReg);
      defined.emplace(globalReg);
      if (!firstTime && !isIn(constant, globalReg))
        continue;

      auto lit = ir::dyc<ir::IntLiteral>(store->getVal());
      if (!lit) {
        if (isIn(constant, globalReg))
          constant.erase(constant.find(globalReg));
        continue;
      }

      if (!firstTime && constant.at(globalReg) != lit->getVal()) {
        constant.erase(constant.find(globalReg));
        continue;
      }
      constant[globalReg] = lit->getVal();
    }
  }
}